

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_gencall(ASMState *as,CCallInfo *ci,IRRef *args)

{
  uint uVar1;
  uint ref_00;
  MCode *pMVar2;
  Reg RVar3;
  IRIns *ir_00;
  x86Op xo;
  uint local_60;
  uint local_5c;
  Reg r;
  IRIns *ir;
  MCode *pMStack_48;
  IRRef ref;
  MCode *patchnfpr;
  uint local_38;
  Reg fpr;
  uint32_t gprs;
  int32_t ofs;
  uint32_t nargs;
  uint32_t n;
  IRRef *args_local;
  CCallInfo *ci_local;
  ASMState *as_local;
  
  uVar1 = ci->flags;
  fpr = 0;
  local_38 = 0x128088c7;
  patchnfpr._4_4_ = 0x10;
  pMStack_48 = (MCode *)0x0;
  if (ci->func != (ASMFunction)0x0) {
    emit_call_(as,(MCode *)ci->func);
  }
  if ((ci->flags & 0x800) != 0) {
    pMStack_48 = as->mcp + -1;
    as->mcp = pMStack_48;
    pMVar2 = as->mcp;
    as->mcp = pMVar2 + -1;
    pMVar2[-1] = 0xb0;
  }
  ofs = 0;
  while( true ) {
    if ((uVar1 & 0xff) <= (uint)ofs) {
      if (pMStack_48 != (MCode *)0x0) {
        *pMStack_48 = (char)patchnfpr._4_4_ + 0xf0;
      }
      return;
    }
    ref_00 = args[(uint)ofs];
    ir_00 = as->ir + ref_00;
    if ((((ir_00->field_1).t.irt & 0x1f) == 0xe) || (((ir_00->field_1).t.irt & 0x1f) == 0xd)) {
      if (patchnfpr._4_4_ < 0x18) {
        local_60 = patchnfpr._4_4_;
        patchnfpr._4_4_ = patchnfpr._4_4_ + 1;
      }
      else {
        local_60 = 0;
      }
      local_5c = local_60;
    }
    else {
      local_5c = local_38 & 0x1f;
      local_38 = local_38 >> 5;
    }
    if (local_5c == 0) {
      if ((((ir_00->field_1).t.irt & 0x1f) == 0xe) || (((ir_00->field_1).t.irt & 0x1f) == 0xd)) {
        RVar3 = ra_alloc1(as,ref_00,0xffff0000);
        xo = XO_MOVSSto;
        if (((ir_00->field_1).t.irt & 0x1f) == 0xe) {
          xo = XO_MOVSDto;
        }
        emit_rmro(as,xo,RVar3,4,fpr);
      }
      else {
        RVar3 = ra_alloc1(as,ref_00,0xbfef);
        emit_rmro(as,XO_MOVto,RVar3 + 0x80200,4,fpr);
      }
      fpr = fpr + 8;
    }
    else if ((local_5c < 0x10) && (ref_00 < 0x7ffd)) {
      if (((ir_00->field_1).o == '\x17') || ((ir_00->field_1).o == '\x1b')) {
        emit_loadi(as,local_5c,ir_00->i);
      }
      else {
        emit_loadu64(as,local_5c,(uint64_t)ir_00[1]);
      }
    }
    else if (((ir_00->field_1).r & 0x80) == 0) {
      as->weakset = (1 << ((ir_00->field_1).r & 0x1f) ^ 0xffffffffU) & as->weakset;
      emit_movrr(as,ir_00,local_5c,(uint)(ir_00->field_1).r);
    }
    else {
      ra_allocref(as,ref_00,1 << ((byte)local_5c & 0x1f));
    }
    if (as->mcp < as->mclim) break;
    ofs = ofs + 1;
  }
  asm_mclimit(as);
}

Assistant:

static void asm_gencall(ASMState *as, const CCallInfo *ci, IRRef *args)
{
  uint32_t n, nargs = CCI_XNARGS(ci);
  int32_t ofs = STACKARG_OFS;
#if LJ_64
  uint32_t gprs = REGARG_GPRS;
  Reg fpr = REGARG_FIRSTFPR;
#if !LJ_ABI_WIN
  MCode *patchnfpr = NULL;
#endif
#else
  uint32_t gprs = 0;
  if ((ci->flags & CCI_CC_MASK) != CCI_CC_CDECL) {
    if ((ci->flags & CCI_CC_MASK) == CCI_CC_THISCALL)
      gprs = (REGARG_GPRS & 31);
    else if ((ci->flags & CCI_CC_MASK) == CCI_CC_FASTCALL)
      gprs = REGARG_GPRS;
  }
#endif
  if ((void *)ci->func)
    emit_call(as, ci->func);
#if LJ_64
  if ((ci->flags & CCI_VARARG)) {  /* Special handling for vararg calls. */
#if LJ_ABI_WIN
    for (n = 0; n < 4 && n < nargs; n++) {
      IRIns *ir = IR(args[n]);
      if (irt_isfp(ir->t))  /* Duplicate FPRs in GPRs. */
	emit_rr(as, XO_MOVDto, (irt_isnum(ir->t) ? REX_64 : 0) | (fpr+n),
		((gprs >> (n*5)) & 31));  /* Either MOVD or MOVQ. */
    }
#else
    patchnfpr = --as->mcp;  /* Indicate number of used FPRs in register al. */
    *--as->mcp = XI_MOVrib | RID_EAX;
#endif
  }
#endif
  for (n = 0; n < nargs; n++) {  /* Setup args. */
    IRRef ref = args[n];
    IRIns *ir = IR(ref);
    Reg r;
#if LJ_64 && LJ_ABI_WIN
    /* Windows/x64 argument registers are strictly positional. */
    r = irt_isfp(ir->t) ? (fpr <= REGARG_LASTFPR ? fpr : 0) : (gprs & 31);
    fpr++; gprs >>= 5;
#elif LJ_64
    /* POSIX/x64 argument registers are used in order of appearance. */
    if (irt_isfp(ir->t)) {
      r = fpr <= REGARG_LASTFPR ? fpr++ : 0;
    } else {
      r = gprs & 31; gprs >>= 5;
    }
#else
    if (ref && irt_isfp(ir->t)) {
      r = 0;
    } else {
      r = gprs & 31; gprs >>= 5;
      if (!ref) continue;
    }
#endif
    if (r) {  /* Argument is in a register. */
      if (r < RID_MAX_GPR && ref < ASMREF_TMP1) {
#if LJ_64
	if (LJ_GC64 ? !(ir->o == IR_KINT || ir->o == IR_KNULL) : ir->o == IR_KINT64)
	  emit_loadu64(as, r, ir_k64(ir)->u64);
	else
#endif
	  emit_loadi(as, r, ir->i);
      } else {
	/* Must have been evicted. */
	lj_assertA(rset_test(as->freeset, r), "reg %d not free", r);
	if (ra_hasreg(ir->r)) {
	  ra_noweak(as, ir->r);
	  emit_movrr(as, ir, r, ir->r);
	} else {
	  ra_allocref(as, ref, RID2RSET(r));
	}
      }
    } else if (irt_isfp(ir->t)) {  /* FP argument is on stack. */
      lj_assertA(!(irt_isfloat(ir->t) && irref_isk(ref)),
		 "unexpected float constant");
      if (LJ_32 && (ofs & 4) && irref_isk(ref)) {
	/* Split stores for unaligned FP consts. */
	emit_movmroi(as, RID_ESP, ofs, (int32_t)ir_knum(ir)->u32.lo);
	emit_movmroi(as, RID_ESP, ofs+4, (int32_t)ir_knum(ir)->u32.hi);
      } else {
	r = ra_alloc1(as, ref, RSET_FPR);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSDto : XO_MOVSSto,
		  r, RID_ESP, ofs);
      }
      ofs += (LJ_32 && irt_isfloat(ir->t)) ? 4 : 8;
    } else {  /* Non-FP argument is on stack. */
      if (LJ_32 && ref < ASMREF_TMP1) {
	emit_movmroi(as, RID_ESP, ofs, ir->i);
      } else {
	r = ra_alloc1(as, ref, RSET_GPR);
	emit_movtomro(as, REX_64 + r, RID_ESP, ofs);
      }
      ofs += sizeof(intptr_t);
    }
    checkmclim(as);
  }
#if LJ_64 && !LJ_ABI_WIN
  if (patchnfpr) *patchnfpr = fpr - REGARG_FIRSTFPR;
#endif
}